

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O2

void m68k_op_bcs_32(void)

{
  uint uVar1;
  
  if (((ushort)m68ki_cpu.cpu_type & 0x3f8) == 0) {
    if ((m68ki_cpu.c_flag >> 8 & 1) == 0) {
      m68ki_remaining_cycles = m68ki_remaining_cycles - m68ki_cpu.cyc_bcc_notake_b;
    }
    else {
      m68ki_cpu.pc = m68ki_cpu.pc + (int)(char)m68ki_cpu.ir;
    }
  }
  else if ((m68ki_cpu.c_flag >> 8 & 1) == 0) {
    m68ki_cpu.pc = m68ki_cpu.pc + 4;
  }
  else {
    uVar1 = m68ki_read_imm_32();
    m68ki_cpu.pc = (uVar1 + m68ki_cpu.pc) - 4;
  }
  return;
}

Assistant:

static void m68k_op_bcs_32(void)
{
	if(CPU_TYPE_IS_EC020_PLUS(CPU_TYPE))
	{
		if(COND_CS())
		{
			uint offset = OPER_I_32();
			REG_PC -= 4;
			m68ki_trace_t0();			   /* auto-disable (see m68kcpu.h) */
			m68ki_branch_32(offset);
			return;
		}
		REG_PC += 4;
		return;
	}
	else
	{
		if(COND_CS())
		{
			m68ki_trace_t0();			   /* auto-disable (see m68kcpu.h) */
			m68ki_branch_8(MASK_OUT_ABOVE_8(REG_IR));
			return;
		}
		USE_CYCLES(CYC_BCC_NOTAKE_B);
	}
}